

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void smult(double *A,double *B,double *C,int m,int n,int p)

{
  int p_00;
  double *Y;
  double *B_00;
  double *Y_00;
  long lVar1;
  long lVar2;
  int iVar3;
  int zcol;
  int iVar4;
  long lVar5;
  int local_8c;
  int local_88;
  int a;
  int b;
  int c;
  double *local_78;
  double *local_70;
  double *local_68;
  long local_60;
  long local_58;
  double *local_50;
  double *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_8c = m;
  local_88 = n;
  a = p;
  _b = C;
  local_78 = B;
  local_70 = A;
  local_3c = p;
  local_38 = m;
  local_34 = n;
  findrec(&local_8c,&local_88,&a);
  iVar3 = local_88;
  iVar4 = local_8c;
  local_60 = (long)local_8c;
  lVar5 = local_60 * 8;
  lVar1 = (long)local_88;
  Y_00 = (double *)malloc(lVar5 * lVar1);
  p_00 = a;
  lVar2 = (long)a;
  local_58 = lVar1;
  local_48 = (double *)malloc(lVar1 * lVar2 * 8);
  local_68 = (double *)malloc(lVar5 * lVar2);
  iVar4 = iVar4 - local_38;
  iVar3 = iVar3 - local_34;
  local_50 = Y_00;
  add_zero_pad(local_70,local_38,local_34,iVar4,iVar3,Y_00);
  B_00 = local_48;
  zcol = p_00 - local_3c;
  add_zero_pad(local_78,local_34,local_3c,iVar3,zcol,local_48);
  Y = local_68;
  iVar3 = (int)local_60;
  srecmult(Y_00,B_00,local_68,iVar3,(int)local_58,p_00,(int)local_58,p_00,p_00);
  remove_zero_pad(Y,iVar3,p_00,iVar4,zcol,_b);
  free(local_50);
  free(local_48);
  free(Y);
  return;
}

Assistant:

void smult(double* A, double* B, double* C,int m,int n, int p) {
	int a,b,c,nrec;
	double *X,*Y,*Z,*P;
	a = m;
	b = n;
	c = p;
	nrec = findrec(&a,&b,&c);
	X = (double*) malloc(sizeof(double) * a * b);
	Y = (double*) malloc(sizeof(double) * b * c);
	Z = (double*) malloc(sizeof(double) * a * c);
	P = (double*) malloc(sizeof(double) * (a/2) * (c/2));

	
	add_zero_pad(A,m,n,a-m,b-n,X);
	add_zero_pad(B,n,p,b-n,c-p,Y);

	srecmult(X,Y,Z,a,b,c,b,c,c);
	// Memory allocation needs work
	
	remove_zero_pad(Z,a,c,a-m,c-p,C);
	
	// free X,Y,Z
	free(X);
	free(Y);
	free(Z);
	free(P);
	
}